

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void debugcode(char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *fmt_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [8];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  long local_48;
  ident *id;
  identlink *l_1;
  identlink *l;
  int depth;
  int total;
  va_list args;
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  if (nodebug == 0) {
    args[0].overflow_arg_area = local_f8;
    args[0]._0_8_ = &stack0x00000008;
    total = 0x30;
    depth = 8;
    local_f0 = in_RSI;
    local_e8 = in_RDX;
    local_e0 = in_RCX;
    local_d8 = in_R8;
    local_d0 = in_R9;
    args[0].reg_save_area = fmt;
    conoutfv(4,fmt,(__va_list_tag *)&depth);
    if (dbgalias != 0) {
      l._4_4_ = 0;
      l._0_4_ = 0;
      for (l_1 = aliasstack; l_1 != &noalias; l_1 = l_1->next) {
        l._4_4_ = l._4_4_ + 1;
      }
      for (id = (ident *)aliasstack; id != (ident *)&noalias; id = (ident *)id->name) {
        local_48 = *(long *)id;
        l._0_4_ = (int)l + 1;
        if ((int)l < dbgalias) {
          conoutf(4,"  %d) %s",(ulong)((l._4_4_ - (int)l) + 1),*(undefined8 *)(local_48 + 8));
        }
        else if ((identlink *)id->name == &noalias) {
          fmt_00 = "  ..%d) %s";
          if ((int)l == dbgalias) {
            fmt_00 = "  %d) %s";
          }
          conoutf(4,fmt_00,(ulong)((l._4_4_ - (int)l) + 1),*(undefined8 *)(local_48 + 8));
        }
      }
    }
  }
  return;
}

Assistant:

static void debugcode(const char *fmt, ...)
{
    if(nodebug) return;

    va_list args;
    va_start(args, fmt);
    conoutfv(CON_ERROR, fmt, args);
    va_end(args);

    if(!dbgalias) return;
    int total = 0, depth = 0;
    for(identlink *l = aliasstack; l != &noalias; l = l->next) total++;
    for(identlink *l = aliasstack; l != &noalias; l = l->next)
    {
        ident *id = l->id;
        ++depth;
        if(depth < dbgalias) conoutf(CON_ERROR, "  %d) %s", total-depth+1, id->name);
        else if(l->next == &noalias) conoutf(CON_ERROR, depth == dbgalias ? "  %d) %s" : "  ..%d) %s", total-depth+1, id->name);
    }
}